

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_oram.h
# Opt level: O0

int __thiscall PathOram::access(PathOram *this,char *__name,int __type)

{
  undefined1 uVar1;
  undefined8 extraout_RAX;
  int unaff_retaddr;
  Bucket<int> *in_stack_00000008;
  bool res;
  int old_pos;
  int in_stack_0000008c;
  PathOram *in_stack_00000090;
  int in_stack_ffffffffffffffdc;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  std::vector<int,_std::allocator<int>_>::operator[]
            (&(this->super_TreeOram).index,(long)(int)__name);
  uVar1 = TreeOram::readAndRemove
                    ((TreeOram *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),
                     (int)((ulong)this >> 0x20));
  Bucket<int>::add(in_stack_00000008,unaff_retaddr);
  TreeOram::update_pos(&this->super_TreeOram,in_stack_ffffffffffffffdc);
  flush(in_stack_00000090,in_stack_0000008c);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),uVar1) & 0xffffff01;
}

Assistant:

bool access(int identifier)
      {
         int old_pos = index[identifier];
         bool res = readAndRemove(identifier);
         stash->add(identifier);
         update_pos(identifier);
         flush(old_pos);
         return res;
      }